

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::flush(Logger *this,Level level,fstream_t *fs)

{
  bool bVar1;
  pointer ppVar2;
  fstream_t *in_RDX;
  TypedConfigurations *in_RDI;
  iterator iter;
  undefined4 in_stack_ffffffffffffffc8;
  Level in_stack_ffffffffffffffcc;
  _Node_iterator_base<std::pair<const_el::Level,_unsigned_int>,_true> local_28;
  _Node_iterator_base<std::pair<const_el::Level,_unsigned_int>,_true> local_20;
  fstream_t *local_18;
  
  local_18 = in_RDX;
  if ((in_RDX == (fstream_t *)0x0) &&
     (bVar1 = el::base::TypedConfigurations::toFile(in_RDI,in_stack_ffffffffffffffcc), bVar1)) {
    local_18 = el::base::TypedConfigurations::fileStream(in_RDI,in_stack_ffffffffffffffcc);
  }
  if (local_18 != (fstream_t *)0x0) {
    std::ostream::flush();
    local_20._M_cur =
         (__node_type *)
         el::base::utils::std::
         unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
         ::find((unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
                 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                (key_type *)0x22802f);
    local_28._M_cur =
         (__node_type *)
         el::base::utils::std::
         unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
         ::end((unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
                *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    bVar1 = el::base::utils::std::__detail::operator!=(&local_20,&local_28);
    if (bVar1) {
      ppVar2 = el::base::utils::std::__detail::
               _Node_iterator<std::pair<const_el::Level,_unsigned_int>,_false,_true>::operator->
                         ((_Node_iterator<std::pair<const_el::Level,_unsigned_int>,_false,_true> *)
                          0x228069);
      ppVar2->second = 0;
    }
  }
  return;
}

Assistant:

void Logger::flush(Level level, base::type::fstream_t* fs) {
  if (fs == nullptr && m_typedConfigurations->toFile(level)) {
    fs = m_typedConfigurations->fileStream(level);
  }
  if (fs != nullptr) {
    fs->flush();
    std::unordered_map<Level, unsigned int>::iterator iter = m_unflushedCount.find(level);
    if (iter != m_unflushedCount.end()) {
      iter->second = 0;
    }
  }
}